

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_slist *pcVar3;
  curl_trc_feat *pcVar4;
  Curl_addrinfo *pCVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  Curl_addrinfo *pCVar11;
  void *pvVar12;
  Curl_dns_entry *pCVar13;
  uint uVar14;
  ulong in_R8;
  char *pcVar15;
  char *__s;
  Curl_addrinfo *pCVar16;
  size_t sVar17;
  char *pcVar18;
  bool bVar19;
  char address [64];
  char entry_id [262];
  Curl_addrinfo *local_1c0;
  ulong local_1b8;
  size_t local_1a0;
  char *local_190;
  CURLcode local_184;
  char *local_180;
  char local_178 [64];
  char local_138 [264];
  
  puVar1 = &(data->state).field_0x776;
  *puVar1 = *puVar1 & 0xfe;
  pcVar3 = (data->state).resolve;
  do {
    if (pcVar3 == (curl_slist *)0x0) {
      (data->state).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar8 = pcVar3->data;
    if (pcVar8 == (char *)0x0) {
      uVar14 = 0;
    }
    else {
      if (*pcVar8 == '-') {
        pcVar6 = strchr(pcVar8 + 1,0x3a);
        if (pcVar6 == (char *)0x0) {
          bVar19 = true;
          sVar17 = 0;
          uVar7 = 0;
        }
        else {
          uVar7 = strtoul(pcVar6 + 1,(char **)0x0,10);
          sVar17 = (long)pcVar6 - (long)(pcVar8 + 1);
          bVar19 = 0xffff < uVar7 || sVar17 == 0;
        }
        if (bVar19) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"Bad syntax CURLOPT_RESOLVE removal entry \'%s\'",pcVar3->data);
          }
        }
        else {
          sVar17 = create_hostcache_id(pcVar3->data + 1,sVar17,(int)uVar7,local_138,in_R8);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,local_138,sVar17 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
        }
        uVar14 = 0;
        if (bVar19) goto LAB_001321cf;
      }
      else {
        cVar2 = *pcVar3->data;
        pcVar6 = pcVar3->data + (cVar2 == '+');
        pcVar8 = strchr(pcVar6,0x3a);
        bVar19 = true;
        if (pcVar8 == (char *)0x0) {
          local_1c0 = (Curl_addrinfo *)0x0;
          pcVar8 = (char *)0x0;
          local_1b8 = 0;
          local_1a0 = 0;
        }
        else {
          local_1a0 = (long)pcVar8 - (long)pcVar6;
          local_1b8 = strtoul(pcVar8 + 1,&local_190,10);
          if (((local_1b8 < 0x10000) && (local_190 != pcVar8 + 1)) && (*local_190 == ':')) {
            pcVar8 = local_190 + 1;
            if (*local_190 == '\0') {
              local_1c0 = (Curl_addrinfo *)0x0;
              pcVar9 = local_190;
            }
            else {
              local_1c0 = (Curl_addrinfo *)0x0;
              pcVar15 = local_190;
              pCVar16 = (Curl_addrinfo *)0x0;
              local_180 = pcVar8;
              do {
                __s = pcVar15 + 1;
                pcVar9 = strchr(__s,0x2c);
                if (pcVar9 == (char *)0x0) {
                  sVar10 = strlen(__s);
                  pcVar9 = __s + sVar10;
                }
                pcVar18 = pcVar9;
                pCVar11 = pCVar16;
                pCVar5 = local_1c0;
                if (*__s == '[') {
                  uVar14 = 7;
                  if ((pcVar9 != __s) && (pcVar9[-1] == ']')) {
                    __s = pcVar15 + 2;
                    pcVar18 = pcVar9 + -1;
                    goto LAB_00131ffd;
                  }
                }
                else {
LAB_00131ffd:
                  uVar7 = (long)pcVar18 - (long)__s;
                  pcVar8 = local_180;
                  if (uVar7 == 0) {
                    uVar14 = 8;
                  }
                  else {
                    uVar14 = 7;
                    if (uVar7 < 0x40) {
                      memcpy(local_178,__s,uVar7);
                      local_178[uVar7] = '\0';
                      pCVar11 = Curl_str2addr(local_178,(int)local_1b8);
                      pcVar8 = local_180;
                      if (pCVar11 == (Curl_addrinfo *)0x0) {
                        pCVar11 = pCVar16;
                        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0))
                           && ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                               (0 < pcVar4->log_level)))) {
                          Curl_infof(data,"Resolve address \'%s\' found illegal",local_178);
                        }
                      }
                      else {
                        uVar14 = 0;
                        pCVar5 = pCVar11;
                        if (pCVar16 != (Curl_addrinfo *)0x0) {
                          pCVar16->ai_next = pCVar11;
                          pCVar5 = local_1c0;
                        }
                      }
                    }
                  }
                }
                local_1c0 = pCVar5;
                if ((uVar14 != 0) && (uVar14 != 8)) {
                  local_190 = pcVar9;
                  if (uVar14 != 7) goto LAB_0013240e;
                  goto LAB_00132208;
                }
                pcVar15 = pcVar9;
                pCVar16 = pCVar11;
              } while (*pcVar9 != '\0');
            }
            bVar19 = local_1c0 == (Curl_addrinfo *)0x0;
            local_190 = pcVar9;
          }
          else {
            local_1c0 = (Curl_addrinfo *)0x0;
            pcVar8 = (char *)0x0;
            local_1b8 = 0;
          }
        }
LAB_00132208:
        if (bVar19) {
          Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar3->data);
          Curl_freeaddrinfo(local_1c0);
          local_184 = CURLE_SETOPT_OPTION_SYNTAX;
LAB_00132409:
          uVar14 = 1;
        }
        else {
          sVar17 = create_hostcache_id(pcVar6,local_1a0,(int)local_1b8,local_138,in_R8);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          pvVar12 = Curl_hash_pick((data->dns).hostcache,local_138,sVar17 + 1);
          if (pvVar12 != (void *)0x0) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              Curl_infof(data,"RESOLVE %.*s:%d - old addresses discarded",local_1a0,pcVar6,local_1b8
                        );
            }
            Curl_hash_delete((data->dns).hostcache,local_138,sVar17 + 1);
          }
          in_R8 = local_1b8;
          pCVar13 = Curl_cache_addr(data,local_1c0,pcVar6,local_1a0,(int)local_1b8,cVar2 != '+');
          if (pCVar13 != (Curl_dns_entry *)0x0) {
            pCVar13->refcount = pCVar13->refcount - 1;
          }
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          if (pCVar13 == (Curl_dns_entry *)0x0) {
            Curl_freeaddrinfo(local_1c0);
            local_184 = CURLE_OUT_OF_MEMORY;
            goto LAB_00132409;
          }
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            pcVar9 = " (non-permanent)";
            if (cVar2 != '+') {
              pcVar9 = "";
            }
            in_R8 = local_1b8;
            Curl_infof(data,"Added %.*s:%d:%s to DNS cache%s",local_1a0,pcVar6,local_1b8,pcVar8,
                       pcVar9);
          }
          uVar14 = 0;
          if ((local_1a0 == 1) && (*pcVar6 == '*')) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              Curl_infof(data,"RESOLVE *:%d using wildcard",local_1b8);
            }
            puVar1 = &(data->state).field_0x776;
            *puVar1 = *puVar1 | 1;
          }
        }
LAB_0013240e:
        if (uVar14 != 0) goto LAB_001321cf;
      }
      uVar14 = 0;
    }
LAB_001321cf:
    if ((uVar14 & 0xb) != 0) {
      return local_184;
    }
    pcVar3 = pcVar3->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char *host_end;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      unsigned long num = 0;
      size_t entry_len;
      size_t hlen = 0;
      host_end = strchr(&hostp->data[1], ':');

      if(host_end) {
        hlen = host_end - &hostp->data[1];
        num = strtoul(++host_end, NULL, 10);
        if(!hlen || (num > 0xffff))
          host_end = NULL;
      }
      if(!host_end) {
        infof(data, "Bad syntax CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }
      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(&hostp->data[1], hlen, (int)num,
                                      entry_id, sizeof(entry_id));
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it did not exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      int port = 0;
      char *end_ptr;
      bool permanent = TRUE;
      unsigned long tmp_port;
      bool error = TRUE;
      char *host_begin = hostp->data;
      size_t hlen = 0;

      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end)
        goto err;
      hlen = host_end - host_begin;

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef USE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(host_begin, hlen, port,
                                      entry_id, sizeof(entry_id));

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%d - old addresses discarded",
              (int)hlen, host_begin, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, host_begin, hlen, port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%d:%s to DNS cache%s",
            (int)hlen, host_begin, port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if((hlen == 1) && (host_begin[0] == '*')) {
        infof(data, "RESOLVE *:%d using wildcard", port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}